

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::Initialize
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this)

{
  TPZDohrAssembly<std::complex<double>_> *pTVar1;
  TPZVec<int> *pTVar2;
  long lVar3;
  TPZSkylMatrix<std::complex<double>_> *this_00;
  TPZStepSolver<std::complex<double>_> *this_01;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _List_node_base *p_Var8;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_a0;
  TPZManVector<long,_10> skyline;
  
  TPZManVector<long,_10>::TPZManVector(&skyline,this->fNumCoarse);
  for (lVar3 = 0; lVar3 < this->fNumCoarse; lVar3 = lVar3 + 1) {
    skyline.super_TPZVec<long>.fStore[lVar3] = lVar3;
  }
  pTVar1 = ((this->fAssemble).fRef)->fPointer;
  lVar3 = (pTVar1->fCoarseEqs).fNElements;
  if (lVar3 < 1) {
    lVar3 = 0;
  }
  for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    pTVar2 = (pTVar1->fCoarseEqs).fStore;
    lVar5 = pTVar2[lVar4].fNElements;
    if (lVar5 == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)*pTVar2[lVar4].fStore;
    }
    if (lVar5 < 1) {
      lVar5 = 0;
    }
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      if (pTVar2[lVar4].fStore[lVar7] <= lVar6) {
        lVar6 = (long)pTVar2[lVar4].fStore[lVar7];
      }
    }
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      if (lVar6 < skyline.super_TPZVec<long>.fStore[pTVar2[lVar4].fStore[lVar7]]) {
        skyline.super_TPZVec<long>.fStore[pTVar2[lVar4].fStore[lVar7]] = lVar6;
      }
    }
  }
  this_00 = (TPZSkylMatrix<std::complex<double>_> *)operator_new(0x60);
  TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix
            (this_00,this->fNumCoarse,&skyline.super_TPZVec<long>);
  lVar3 = 0;
  p_Var8 = (_List_node_base *)&this->fGlobal;
  while (p_Var8 = (((_List_base<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                     *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&this->fGlobal) {
    TPZDohrSubstruct<std::complex<double>_>::Contribute_Kc
              (*(TPZDohrSubstruct<std::complex<double>_> **)p_Var8[1]._M_next,
               (TPZMatrix<std::complex<double>_> *)this_00,
               (TPZVec<int> *)
               ((long)&((((this->fAssemble).fRef)->fPointer->fCoarseEqs).fStore)->_vptr_TPZVec +
               lVar3));
    lVar3 = lVar3 + 0x20;
  }
  this_01 = (TPZStepSolver<std::complex<double>_> *)operator_new(0x100);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer
            (&local_a0,(TPZMatrix<std::complex<double>_> *)this_00);
  TPZStepSolver<std::complex<double>_>::TPZStepSolver(this_01,&local_a0);
  this->fCoarse = this_01;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_a0);
  TPZManVector<long,_10>::~TPZManVector(&skyline);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Initialize()
{
	//Compute the skyline of the coarse equations
	TPZManVector<int64_t> skyline(fNumCoarse);
	int64_t ic;
	for (ic=0; ic<fNumCoarse; ic++) {
		skyline[ic] = ic;
	}
	int64_t nsub = fAssemble->fCoarseEqs.NElements();
	int64_t isub;
	for (isub=0; isub<nsub; isub++) {
		int64_t nc = fAssemble->fCoarseEqs[isub].NElements();
		int64_t ic;
		int64_t mineq = 0;
        if(nc != 0) mineq = fAssemble->fCoarseEqs[isub][0];
		for (ic=0; ic<nc; ic++) {
			int64_t eq = fAssemble->fCoarseEqs[isub][ic];
			mineq = mineq > eq ? eq : mineq;
		}
		for (ic=0; ic<nc; ic++) {
			int64_t eq = fAssemble->fCoarseEqs[isub][ic];
			if(skyline[eq] > mineq) skyline[eq] = mineq;
		}
	}
	/* Computing K(c) */
	TPZMatrix<TVar> *coarse = new TPZSkylMatrix<TVar>(fNumCoarse,skyline);
#ifdef PZDEBUG
	{
		TPZFMatrix<TVar> coarse2(*coarse);
		for (isub=0; isub<nsub; isub++) {
			int64_t nc = fAssemble->fCoarseEqs[isub].NElements();
			int64_t ic;
			for (ic=0; ic<nc; ic++) {
				int64_t ieq = fAssemble->fCoarseEqs[isub][ic];
				int64_t jc;
				for (jc=0; jc<nc; jc++) {
					int64_t jeq = fAssemble->fCoarseEqs[isub][jc];
					coarse2(ieq,jeq) = 1.;
				}
			}
			
		}
		VisualMatrix(coarse2,"CoarseMatrix.vtk");
	}
#endif
	typename std::list<TPZAutoPointer<TSubStruct> >::iterator it;
	int count = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,count++)
	{
		(*it)->Contribute_Kc(*coarse,fAssemble->fCoarseEqs[count]);
	}
	fCoarse = new TPZStepSolver<TVar>(coarse);
}